

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycle.c
# Opt level: O0

GEN_DATA * new_gen_data(void)

{
  GEN_DATA *gen;
  GEN_DATA *local_8;
  
  if (gen_data_free == (GEN_DATA *)0x0) {
    local_8 = (GEN_DATA *)operator_new(0x360);
  }
  else {
    local_8 = gen_data_free;
    gen_data_free = gen_data_free->next;
  }
  memcpy(local_8,&new_gen_data::gen_zero,0x360);
  local_8->valid = true;
  return local_8;
}

Assistant:

GEN_DATA *new_gen_data(void)
{
	static GEN_DATA gen_zero;
	GEN_DATA *gen;

	if (gen_data_free == nullptr)
	{
		gen = new GEN_DATA;
	}
	else
	{
		gen = gen_data_free;
		gen_data_free = gen_data_free->next;
	}

	*gen = gen_zero;

	gen->valid = true;
	return gen;
}